

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O2

void __thiscall
LASreadItemCompressed_RGBNIR14_v3::~LASreadItemCompressed_RGBNIR14_v3
          (LASreadItemCompressed_RGBNIR14_v3 *this)

{
  ArithmeticModel *pAVar1;
  ArithmeticDecoder *pAVar2;
  long lVar3;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015fae0;
  for (lVar3 = 0; lVar3 != 0x180; lVar3 = lVar3 + 0x60) {
    pAVar1 = *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar3 + 0xe);
    if (pAVar1 != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec_RGB,pAVar1);
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar3 + 0x16));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar3 + 0x1e));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar3 + 0x26));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar3 + 0x2e));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar3 + 0x36));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar3 + 0x3e));
    }
    pAVar1 = *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar3 + 0x46);
    if (pAVar1 != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec_NIR,pAVar1);
      ArithmeticDecoder::destroySymbolModel
                (this->dec_NIR,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar3 + 0x4e));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_NIR,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar3 + 0x56));
    }
  }
  if (this->instream_RGB != (ByteStreamInArray *)0x0) {
    (*(this->instream_RGB->super_ByteStreamIn)._vptr_ByteStreamIn[0xe])();
    pAVar2 = this->dec_RGB;
    if (pAVar2 != (ArithmeticDecoder *)0x0) {
      ArithmeticDecoder::~ArithmeticDecoder(pAVar2);
    }
    operator_delete(pAVar2);
  }
  if (this->instream_NIR != (ByteStreamInArray *)0x0) {
    (*(this->instream_NIR->super_ByteStreamIn)._vptr_ByteStreamIn[0xe])();
    pAVar2 = this->dec_NIR;
    if (pAVar2 != (ArithmeticDecoder *)0x0) {
      ArithmeticDecoder::~ArithmeticDecoder(pAVar2);
    }
    operator_delete(pAVar2);
  }
  if (this->bytes != (U8 *)0x0) {
    operator_delete__(this->bytes);
    return;
  }
  return;
}

Assistant:

LASreadItemCompressed_RGBNIR14_v3::~LASreadItemCompressed_RGBNIR14_v3()
{
  /* destroy all initialized scanner channel contexts */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_rgb_bytes_used)
    {
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_bytes_used);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_0);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_1);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_2);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_3);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_4);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_5);
    }

    if (contexts[c].m_nir_bytes_used)
    {
      dec_NIR->destroySymbolModel(contexts[c].m_nir_bytes_used);
      dec_NIR->destroySymbolModel(contexts[c].m_nir_diff_0);
      dec_NIR->destroySymbolModel(contexts[c].m_nir_diff_1);
    }
  }

  /* destroy all instreams and decoders */

  if (instream_RGB)
  {
    delete instream_RGB;

    delete dec_RGB;
  }

  if (instream_NIR)
  {
    delete instream_NIR;

    delete dec_NIR;
  }

  if (bytes) delete [] bytes;
}